

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O2

void Ivy_ObjDelete_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fFreeTop)

{
  Ivy_Obj_t *pIVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  
  while( true ) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                    ,0x12e,"void Ivy_ObjDelete_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar2 == 0) {
      __assert_fail("!Ivy_ObjIsNone(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                    ,0x12f,"void Ivy_ObjDelete_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    if ((uVar2 == 1) || (pObj->Id == 0)) {
      return;
    }
    pIVar3 = pObj->pFanin0;
    pIVar1 = pObj->pFanin1;
    Ivy_ObjDelete(p,pObj,fFreeTop);
    pIVar3 = (Ivy_Obj_t *)((ulong)pIVar3 & 0xfffffffffffffffe);
    fFreeTop = 1;
    if (((pIVar3 != (Ivy_Obj_t *)0x0) && ((pIVar3->field_0x8 & 0xf) != 0)) && (pIVar3->nRefs == 0))
    {
      Ivy_ObjDelete_rec(p,pIVar3,1);
    }
    pObj = (Ivy_Obj_t *)((ulong)pIVar1 & 0xfffffffffffffffe);
    if (pObj == (Ivy_Obj_t *)0x0) break;
    if ((pObj->field_0x8 & 0xf) == 0) {
      return;
    }
    if (pObj->nRefs != 0) {
      return;
    }
  }
  return;
}

Assistant:

void Ivy_ObjDelete_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fFreeTop )
{
    Ivy_Obj_t * pFanin0, * pFanin1;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_ObjIsNone(pObj) );
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsPi(pObj) )
        return;
    pFanin0 = Ivy_ObjFanin0(pObj);
    pFanin1 = Ivy_ObjFanin1(pObj);
    Ivy_ObjDelete( p, pObj, fFreeTop );
    if ( pFanin0 && !Ivy_ObjIsNone(pFanin0) && Ivy_ObjRefs(pFanin0) == 0 )
        Ivy_ObjDelete_rec( p, pFanin0, 1 );
    if ( pFanin1 && !Ivy_ObjIsNone(pFanin1) && Ivy_ObjRefs(pFanin1) == 0 )
        Ivy_ObjDelete_rec( p, pFanin1, 1 );
}